

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void md5_ez(char *hash,char *msg,size_t len)

{
  uchar *puVar1;
  long lVar2;
  md5_byte_t digest [16];
  md5_byte_t local_88 [16];
  md5_state_t local_78;
  
  puVar1 = local_88;
  local_78.count[0] = 0;
  local_78.count[1] = 0;
  local_78.abcd[0] = 0x67452301;
  local_78.abcd[1] = 0xefcdab89;
  local_78.abcd[2] = 0x98badcfe;
  local_78.abcd[3] = 0x10325476;
  md5_append(&local_78,(md5_byte_t *)msg,(int)len);
  md5_finish(&local_78,local_88);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 2) {
    byte_to_xdigits(hash + lVar2,*puVar1);
    puVar1 = puVar1 + 1;
  }
  hash[0x20] = '\0';
  return;
}

Assistant:

void md5_ez(char *hash, const char *msg, size_t len)
{
    md5_state_t s;
    md5_byte_t digest[16];

    /* calculate the binary md5 of the message */
    md5_init(&s);
    md5_append(&s, (const md5_byte_t *)msg, len);
    md5_finish(&s, digest);

    /* convert the binary hash to printable hex digits */
    for (int i = 0 ; i < 16 ; ++i, hash += 2)
        byte_to_xdigits(hash, digest[i]);

    /* null-terminate the output string */
    *hash = '\0';
}